

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O0

GeneratorNode * __thiscall
kratos::GeneratorGraph::get_node(GeneratorGraph *this,Generator *generator)

{
  bool bVar1;
  mapped_type *pmVar2;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  undefined1 auVar3 [16];
  format_args args;
  string_view format_str;
  string local_c8;
  _Node_iterator_base<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false> local_a8;
  _Node_iterator_base<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>,_false> local_a0;
  Generator *local_98;
  Generator *generator_local;
  GeneratorGraph *this_local;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  local_80;
  basic_string_view<char> local_78;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  local_68;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_50;
  format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *vargs;
  char *local_40;
  string *local_38;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_30;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_28;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_20;
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  *local_18;
  anon_union_16_15_1c6af150_for_value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_1
  *local_10;
  
  local_98 = generator;
  generator_local = (Generator *)this;
  local_a0._M_cur =
       (__node_type *)
       std::
       unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
       ::find(&this->nodes_,&local_98);
  local_a8._M_cur =
       (__node_type *)
       std::
       unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
       ::end(&this->nodes_);
  bVar1 = std::__detail::operator==(&local_a0,&local_a8);
  if (!bVar1) {
    pmVar2 = std::
             unordered_map<kratos::Generator_*,_kratos::GeneratorNode,_std::hash<kratos::Generator_*>,_std::equal_to<kratos::Generator_*>,_std::allocator<std::pair<kratos::Generator_*const,_kratos::GeneratorNode>_>_>
             ::at(&this->nodes_,&local_98);
    return pmVar2;
  }
  auVar3 = __cxa_allocate_exception(0x10);
  vargs = (format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_98->instance_name;
  local_38 = &local_c8;
  local_40 = "{0} not found in graph!";
  local_68.named_args.data =
       (named_arg_info<char> *)
       fmt::v7::make_args_checked<std::__cxx11::string&,char[24],char>
                 ((format_arg_store<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)"{0} not found in graph!",(v7 *)vargs,auVar3._8_8_,
                  (remove_reference_t<std::__cxx11::basic_string<char>_&> *)
                  "{0} not found in graph!");
  local_50 = &local_68;
  local_78 = fmt::v7::to_string_view<char,_0>(local_40);
  local_28 = (basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
              *)&this_local;
  local_30 = local_50;
  local_20 = local_50;
  local_10 = local_50;
  local_18 = local_28;
  fmt::v7::
  basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>::
  basic_format_args(local_28,0xd,
                    (value<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
                     *)&local_50->string);
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.values_ = in_R9.values_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)local_80.values_;
  format_str.size_ = (size_t)this_local;
  format_str.data_ = (char *)local_78.size_;
  fmt::v7::detail::vformat_abi_cxx11_(&local_c8,(detail *)local_78.data_,format_str,args);
  InternalException::InternalException(auVar3._0_8_,&local_c8);
  __cxa_throw(auVar3._0_8_,&InternalException::typeinfo,InternalException::~InternalException);
}

Assistant:

GeneratorNode *GeneratorGraph::get_node(Generator *generator) {
    if (nodes_.find(generator) == nodes_.end()) {
        throw InternalException(::format("{0} not found in graph!", generator->instance_name));
    }
    return &nodes_.at(generator);
}